

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pam.c
# Opt level: O1

pam_t * pam_copy(pam_t *pam)

{
  int iVar1;
  pam_t *ppVar2;
  uint8_t *__dest;
  
  ppVar2 = (pam_t *)calloc(1,0x20);
  ppVar2->width = pam->width;
  ppVar2->height = pam->height;
  ppVar2->depth = pam->depth;
  ppVar2->maxval = pam->maxval;
  ppVar2->type = pam->type;
  iVar1 = pam->datalen;
  ppVar2->datalen = iVar1;
  __dest = (uint8_t *)malloc((long)iVar1);
  ppVar2->data = __dest;
  memcpy(__dest,pam->data,(long)iVar1);
  return ppVar2;
}

Assistant:

pam_t *pam_copy(pam_t *pam)
{
    pam_t *copy = calloc(1, sizeof(pam_t));
    copy->width = pam->width;
    copy->height = pam->height;
    copy->depth = pam->depth;
    copy->maxval = pam->maxval;
    copy->type = pam->type;

    copy->datalen = pam->datalen;
    copy->data = malloc(pam->datalen);
    memcpy(copy->data, pam->data, pam->datalen);

    return copy;
}